

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  BBox1f BVar8;
  MemoryMonitorInterface *pMVar9;
  Split *pSVar10;
  vint *pvVar11;
  code *pcVar12;
  ThreadLocal2 *pTVar13;
  NodeRefPtr<4> this_00;
  iterator iVar14;
  BBox1f *pBVar15;
  PrimRefMB *pPVar16;
  Scene *pSVar17;
  Geometry *pGVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  vuint<4> vVar31;
  vint *pvVar32;
  char cVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_01;
  BBox1f BVar37;
  long lVar38;
  void *pvVar39;
  ulong uVar40;
  float *pfVar41;
  ulong uVar42;
  long lVar43;
  size_t sVar44;
  undefined8 *puVar45;
  runtime_error *prVar46;
  BBox1f *pBVar47;
  uint *puVar48;
  long lVar49;
  ulong *puVar50;
  byte bVar51;
  pointer *__ptr;
  BuildRecord *in_00;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  size_t i;
  PrimRefMB *pPVar55;
  uint uVar56;
  ulong uVar57;
  char *pcVar58;
  long *plVar59;
  ulong uVar60;
  mvector<PrimRefMB> *prims;
  ulong uVar61;
  bool bVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar96;
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar108;
  undefined1 auVar107 [16];
  float fVar109;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar114;
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  float fVar117;
  undefined1 auVar118 [64];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e58 [16];
  long local_1e40;
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [16];
  undefined1 local_1e08 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dd8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1dc8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1da8;
  PrimRefVector lprims;
  undefined1 local_1d88 [16];
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1cd8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1cc8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c98;
  BBox1f local_1c88;
  size_t sStack_1c80;
  size_t sStack_1c78;
  size_t sStack_1c70;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  anon_class_1_0_00000001 reduction;
  vuint<4> v0;
  undefined1 local_1c28 [16];
  undefined1 auStack_1c18 [16];
  undefined1 local_1c08 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1be8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t sStack_1bb8;
  size_t sStack_1bb0;
  undefined1 auStack_1ba8 [16];
  BBox1f local_1b98;
  undefined8 local_1b88;
  size_t sStack_1b80;
  size_t local_1b78;
  size_t local_1b68;
  size_t sStack_1b60;
  size_t sStack_1b58;
  size_t sStack_1b50;
  undefined1 (*local_1b48) [16];
  undefined8 uStack_1b40;
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b28;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  size_t local_1ac8;
  size_t sStack_1ac0;
  size_t sStack_1ab8;
  size_t sStack_1ab0;
  undefined1 auStack_1aa8 [16];
  BBox1f local_1a98;
  undefined8 local_1a88;
  size_t sStack_1a80;
  size_t local_1a78;
  size_t local_1a68;
  size_t sStack_1a60;
  size_t sStack_1a58;
  size_t sStack_1a50;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  size_t local_18b8 [2];
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1878;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  ulong local_1858;
  ulong uStack_1850;
  size_t sStack_1848;
  undefined8 uStack_1840;
  undefined8 uStack_1838;
  BBox1f BStack_1830;
  BBox1f local_1828;
  longlong local_1818;
  undefined8 uStack_1810;
  size_t local_1808;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d4;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  undefined1 local_17a8 [16];
  undefined1 auStack_1798 [16];
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  ulong local_1758;
  ulong uStack_1750;
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [16];
  size_t local_1708 [4];
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uStack_1b40 = local_1b48;
  uVar40 = in->depth;
  if ((this->cfg).maxDepth < uVar40) {
    puVar45 = (undefined8 *)__cxa_allocate_exception(0x30);
    geomID.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&geomID,"depth limit reached","");
    *puVar45 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar45 + 1) = 1;
    puVar45[2] = puVar45 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar45 + 2),geomID.field_0.v[0],geomID.field_0.v[1] + geomID.field_0.v[0]
              );
    __cxa_throw(puVar45,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  sVar44 = *(size_t *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar5 = *(undefined8 *)
           ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                   geomBounds.bounds0.lower.field_0 + 8);
  uVar25 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar26 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar28 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  local_1da8 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0.m128;
  aVar30 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar29 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar8 = (BBox1f)(in->prims).prims;
  uVar57 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar60 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&geomID,this,&in->prims);
  sStack_1848 = values[0].ref.ptr;
  uStack_1840 = values[0]._8_8_;
  uStack_1838 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1830.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar37 = BStack_1830;
  local_1718._0_8_ = geomID.field_0.v[0];
  local_1818 = geomID.field_0.v[0];
  uStack_1810 = geomID.field_0.v[1];
  local_1808 = local_17b8._0_8_;
  local_17f8 = local_17a8._0_8_;
  uStack_17f0 = local_17a8._8_8_;
  uStack_17e8 = auStack_1798._0_8_;
  uStack_17e0 = auStack_1798._8_8_;
  if ((uVar40 == 1) && (uVar60 != uVar57)) {
    BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1830.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar35 = uVar60 - uVar57;
    if (uVar60 < uVar57 || lVar35 == 0) {
      auVar65 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar47 = &(*(PrimRefMB **)((long)BVar8 + 0x20))[uVar57].time_range;
      auVar65 = ZEXT816(0xff8000007f800000);
      do {
        auVar80._8_8_ = 0;
        auVar80._0_4_ = pBVar47->lower;
        auVar80._4_4_ = pBVar47->upper;
        auVar67 = vcmpps_avx(auVar65,auVar80,1);
        auVar66 = vinsertps_avx(auVar65,auVar80,0x50);
        auVar65 = vblendps_avx(auVar80,auVar65,2);
        auVar65 = vblendvps_avx(auVar65,auVar66,auVar67);
        pBVar47 = pBVar47 + 10;
        lVar35 = lVar35 + -1;
      } while (lVar35 != 0);
    }
    auVar67 = vmovshdup_avx(auVar65);
    auVar67 = vcmpps_avx(auVar67,ZEXT416((uint)BStack_1830.upper),1);
    auVar65 = vcmpps_avx(ZEXT416((uint)BStack_1830.lower),auVar65,1);
    auVar65 = vorps_avx(auVar65,auVar67);
    bVar51 = auVar65[0] & 1;
  }
  else {
    bVar51 = 0;
  }
  local_18b8[0] = sVar44;
  local_18b8[1] = uVar5;
  local_18a8 = uVar25;
  uStack_18a0 = uVar26;
  local_1898 = aVar28;
  local_1888 = local_1da8;
  local_1878 = aVar30;
  local_1868 = aVar29;
  local_1858 = uVar57;
  uStack_1850 = uVar60;
  BStack_1830 = BVar37;
  local_1828 = BVar8;
  if (((uVar60 - uVar57 <= (this->cfg).maxLeafSize) &&
      (uStack_1810._4_4_ = geomID.field_0._12_4_, uStack_1810._4_4_ < 2)) && (bVar51 == 0)) {
    uVar60 = (uVar60 - uVar57) + 3;
    uVar40 = uVar60 >> 2;
    v1.field_0.v[0] = uVar40 * 0x60;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar65 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar65);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar65);
      auVar71 = ZEXT1632(auVar65);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar71;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar71;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar71;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar71;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = this_00.ptr;
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar14._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&v0);
      }
      else {
        *iVar14._M_current = (ThreadLocal2 *)v0.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar44 = (alloc.talloc1)->cur;
    uVar52 = (ulong)(-(int)sVar44 & 0xf);
    uVar42 = sVar44 + v1.field_0.v[0] + uVar52;
    (alloc.talloc1)->cur = uVar42;
    if ((alloc.talloc1)->end < uVar42) {
      (alloc.talloc1)->cur = sVar44;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(v1.field_0.v[0] << 2)) {
        pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
      else {
        geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
        (alloc.talloc1)->ptr = pcVar58;
        sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar44;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = geomID.field_0.v[0];
        (alloc.talloc1)->cur = v1.field_0.v[0];
        if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
          (alloc.talloc1)->cur = 0;
          geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
          (alloc.talloc1)->ptr = pcVar58;
          sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar44;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = geomID.field_0.v[0];
          (alloc.talloc1)->cur = v1.field_0.v[0];
          if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
            (alloc.talloc1)->cur = 0;
            pcVar58 = (char *)0x0;
            goto LAB_01404fab;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar52;
      pcVar58 = (alloc.talloc1)->ptr + (uVar42 - v1.field_0._0_8_);
    }
LAB_01404fab:
    uVar42 = 7;
    if (uVar40 < 7) {
      uVar42 = uVar40;
    }
    if (uVar60 < 4) {
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      local_1e18._8_4_ = 0xff800000;
      local_1e18._0_8_ = 0xff800000ff800000;
      local_1e18._12_4_ = 0xff800000;
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1d88 = auVar69;
    }
    else {
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      local_1e40 = 0;
      auVar118 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar115 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1e18._8_4_ = 0xff800000;
      local_1e18._0_8_ = 0xff800000ff800000;
      local_1e18._12_4_ = 0xff800000;
      local_1d88 = auVar69;
      do {
        pPVar16 = *(PrimRefMB **)((long)local_1828 + 0x20);
        pSVar17 = ((this->createLeaf).bvh)->scene;
        auVar77._8_8_ = 0;
        auVar77._0_4_ = BStack_1830.lower;
        auVar77._4_4_ = BStack_1830.upper;
        auVar78._8_8_ = 0;
        auVar78._0_4_ = BStack_1830.lower;
        auVar78._4_4_ = BStack_1830.upper;
        geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar77,auVar78)
        ;
        pPVar55 = pPVar16 + uVar57;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             auVar118._0_16_;
        lVar35 = 0;
        v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        values[0]._0_16_ = (undefined1  [16])geomID.field_0;
        do {
          if (uVar57 < uStack_1850) {
            fVar4 = (pPVar55->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar35) = fVar4;
            fVar23 = (pPVar55->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&values[0].ref.ptr + lVar35) = fVar23;
            pGVar18 = (pSVar17->geometries).items[(uint)fVar4].ptr;
            lVar36 = (ulong)(uint)fVar23 *
                     pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            lVar38 = *(long *)&pGVar18->field_0x58;
            uVar34 = *(uint *)&pGVar18[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar35) = *(int *)(lVar38 + lVar36) * uVar34;
            *(uint *)((long)&v1.field_0 + lVar35) = *(int *)(lVar38 + 4 + lVar36) * uVar34;
            *(uint *)((long)&v2.field_0 + lVar35) = *(int *)(lVar38 + 8 + lVar36) * uVar34;
            *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .lower.field_0 + lVar35) = uVar34 * *(int *)(lVar38 + 0xc + lVar36);
            uVar57 = uVar57 + 1;
          }
          else if (lVar35 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar35) = geomID.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar35) = 0xffffffff;
            uVar7 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar35) = v0.field_0.i[0];
            *(undefined4 *)((long)&v1.field_0 + lVar35) = uVar7;
            *(undefined4 *)((long)&v2.field_0 + lVar35) = uVar7;
            *(undefined4 *)
             ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar35) = uVar7;
          }
          if (uVar57 < uStack_1850) {
            pPVar55 = pPVar16 + uVar57;
          }
          lVar35 = lVar35 + 4;
        } while (lVar35 != 0x10);
        lVar35 = local_1e40 * 0x60;
        *(longlong *)(pcVar58 + lVar35) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar58 + lVar35) + 8) = v0.field_0.v[1];
        *(longlong *)(pcVar58 + lVar35 + 0x10) = v1.field_0.v[0];
        *(longlong *)((long)(pcVar58 + lVar35 + 0x10) + 8) = v1.field_0.v[1];
        *(longlong *)(pcVar58 + lVar35 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar58 + lVar35 + 0x20) + 8) = v2.field_0.v[1];
        *(undefined8 *)(pcVar58 + lVar35 + 0x30) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar58 + lVar35 + 0x30 + 8) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        *(longlong *)(pcVar58 + lVar35 + 0x40) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar58 + lVar35 + 0x40) + 8) = geomID.field_0.v[1];
        *(size_t *)(pcVar58 + lVar35 + 0x50) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar58 + lVar35 + 0x50) + 8) = values[0]._8_8_;
        auVar66 = vmovshdup_avx(auVar77);
        lVar38 = 0;
        auVar79._8_4_ = 0xff800000;
        auVar79._0_8_ = 0xff800000ff800000;
        auVar79._12_4_ = 0xff800000;
        auVar70._8_4_ = 0x7f800000;
        auVar70._0_8_ = 0x7f8000007f800000;
        auVar70._12_4_ = 0x7f800000;
        auVar65 = auVar79;
        auVar67 = auVar70;
        do {
          if ((ulong)*(uint *)(pcVar58 + lVar38 * 4 + lVar35 + 0x50) == 0xffffffff) break;
          pGVar18 = (pSVar17->geometries).items[*(uint *)(pcVar58 + lVar38 * 4 + lVar35 + 0x40)].ptr
          ;
          fVar4 = pGVar18->fnumTimeSegments;
          fVar23 = (pGVar18->time_range).lower;
          local_1dc8[0].i[0] = BStack_1830.lower;
          fVar63 = (pGVar18->time_range).upper - fVar23;
          fVar84 = ((float)local_1dc8[0]._0_4_ - fVar23) / fVar63;
          local_1b48._0_4_ = auVar66._0_4_;
          fVar63 = (local_1b48._0_4_ - fVar23) / fVar63;
          fVar23 = fVar4 * fVar84;
          fVar98 = fVar4 * fVar63;
          auVar82 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),9);
          auVar24 = vroundss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),10);
          auVar68 = auVar115._0_16_;
          auVar80 = vmaxss_avx(auVar82,auVar68);
          auVar74 = vminss_avx(auVar24,ZEXT416((uint)fVar4));
          iVar6 = (int)auVar82._0_4_;
          if ((int)auVar82._0_4_ < 0) {
            iVar6 = -1;
          }
          uVar34 = (int)fVar4 + 1U;
          if ((int)auVar24._0_4_ < (int)((int)fVar4 + 1U)) {
            uVar34 = (int)auVar24._0_4_;
          }
          lVar36 = *(long *)&pGVar18->field_0x58;
          lVar49 = (ulong)*(uint *)(pcVar58 + lVar38 * 4 + lVar35 + 0x50) *
                   pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar61 = (ulong)*(uint *)(lVar36 + lVar49);
          uVar54 = (ulong)*(uint *)(lVar36 + 4 + lVar49);
          lVar19 = *(long *)&pGVar18[2].numPrimitives;
          lVar53 = (long)(int)auVar80._0_4_ * 0x38;
          lVar20 = *(long *)(lVar19 + lVar53);
          lVar43 = *(long *)(lVar19 + 0x10 + lVar53);
          auVar82 = *(undefined1 (*) [16])(lVar20 + lVar43 * uVar61);
          auVar24 = *(undefined1 (*) [16])(lVar20 + lVar43 * uVar54);
          uVar52 = (ulong)*(uint *)(lVar36 + 8 + lVar49);
          auVar75 = *(undefined1 (*) [16])(lVar20 + lVar43 * uVar52);
          fVar91 = auVar74._0_4_;
          uVar60 = (ulong)*(uint *)(lVar36 + 0xc + lVar49);
          auVar74 = *(undefined1 (*) [16])(lVar20 + lVar43 * uVar60);
          auVar76 = vminps_avx(auVar82,auVar24);
          auVar64 = vminps_avx(auVar75,auVar74);
          auVar73 = vminps_avx(auVar76,auVar64);
          lVar43 = (long)(int)fVar91 * 0x38;
          lVar36 = *(long *)(lVar19 + lVar43);
          lVar20 = *(long *)(lVar19 + 0x10 + lVar43);
          auVar76 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar61);
          auVar64 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar54);
          auVar72 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar52);
          auVar24 = vmaxps_avx(auVar82,auVar24);
          auVar82 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar60);
          auVar74 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmaxps_avx(auVar24,auVar74);
          auVar24 = vminps_avx(auVar76,auVar64);
          auVar75 = vminps_avx(auVar72,auVar82);
          auVar75 = vminps_avx(auVar24,auVar75);
          auVar24 = vmaxps_avx(auVar76,auVar64);
          auVar82 = vmaxps_avx(auVar72,auVar82);
          auVar82 = vmaxps_avx(auVar24,auVar82);
          auVar80 = ZEXT416((uint)(fVar23 - auVar80._0_4_));
          fVar117 = auVar75._0_4_;
          fVar109 = auVar73._0_4_;
          fVar94 = auVar74._0_4_;
          fVar95 = auVar74._4_4_;
          fVar96 = auVar74._8_4_;
          fVar108 = auVar74._12_4_;
          fVar23 = auVar75._4_4_;
          fVar21 = auVar75._8_4_;
          fVar22 = auVar75._12_4_;
          fVar103 = auVar82._0_4_;
          fVar88 = auVar82._4_4_;
          fVar89 = auVar82._8_4_;
          fVar90 = auVar82._12_4_;
          fVar112 = auVar73._4_4_;
          fVar113 = auVar73._8_4_;
          fVar114 = auVar73._12_4_;
          if (uVar34 - iVar6 == 1) {
            auVar80 = vmaxss_avx(auVar80,auVar68);
            auVar74 = vshufps_avx(auVar80,auVar80,0);
            auVar80 = ZEXT416((uint)(1.0 - auVar80._0_4_));
            auVar80 = vshufps_avx(auVar80,auVar80,0);
            auVar81._0_4_ = fVar109 * auVar80._0_4_ + fVar117 * auVar74._0_4_;
            auVar81._4_4_ = fVar112 * auVar80._4_4_ + fVar23 * auVar74._4_4_;
            auVar81._8_4_ = fVar113 * auVar80._8_4_ + fVar21 * auVar74._8_4_;
            auVar81._12_4_ = fVar114 * auVar80._12_4_ + fVar22 * auVar74._12_4_;
            auVar97._0_4_ = fVar94 * auVar80._0_4_ + fVar103 * auVar74._0_4_;
            auVar97._4_4_ = fVar95 * auVar80._4_4_ + fVar88 * auVar74._4_4_;
            auVar97._8_4_ = fVar96 * auVar80._8_4_ + fVar89 * auVar74._8_4_;
            auVar97._12_4_ = fVar108 * auVar80._12_4_ + fVar90 * auVar74._12_4_;
            auVar80 = vmaxss_avx(ZEXT416((uint)(fVar91 - fVar98)),auVar68);
            auVar74 = vshufps_avx(auVar80,auVar80,0);
            auVar80 = ZEXT416((uint)(1.0 - auVar80._0_4_));
            auVar80 = vshufps_avx(auVar80,auVar80,0);
            auVar87._0_4_ = fVar109 * auVar74._0_4_ + fVar117 * auVar80._0_4_;
            auVar87._4_4_ = fVar112 * auVar74._4_4_ + fVar23 * auVar80._4_4_;
            auVar87._8_4_ = fVar113 * auVar74._8_4_ + fVar21 * auVar80._8_4_;
            auVar87._12_4_ = fVar114 * auVar74._12_4_ + fVar22 * auVar80._12_4_;
            auVar93._0_4_ = fVar94 * auVar74._0_4_ + fVar103 * auVar80._0_4_;
            auVar93._4_4_ = fVar95 * auVar74._4_4_ + fVar88 * auVar80._4_4_;
            auVar93._8_4_ = fVar96 * auVar74._8_4_ + fVar89 * auVar80._8_4_;
            auVar93._12_4_ = fVar108 * auVar74._12_4_ + fVar90 * auVar80._12_4_;
LAB_01405690:
            auVar80 = ZEXT816(0) << 0x20;
          }
          else {
            lVar36 = *(long *)(lVar19 + 0x38 + lVar53);
            lVar20 = *(long *)(lVar19 + 0x48 + lVar53);
            auVar74 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar61);
            auVar82 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar54);
            auVar24 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar52);
            auVar68 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar60);
            auVar75 = vminps_avx(auVar74,auVar82);
            auVar76 = vminps_avx(auVar24,auVar68);
            auVar76 = vminps_avx(auVar75,auVar76);
            auVar74 = vmaxps_avx(auVar74,auVar82);
            auVar82 = vmaxps_avx(auVar24,auVar68);
            auVar75 = vmaxps_avx(auVar74,auVar82);
            lVar36 = *(long *)(lVar19 + -0x38 + lVar43);
            lVar20 = *(long *)(lVar19 + -0x28 + lVar43);
            auVar74 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar61);
            auVar82 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar54);
            auVar24 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar52);
            auVar68 = *(undefined1 (*) [16])(lVar36 + lVar20 * uVar60);
            auVar64 = vminps_avx(auVar74,auVar82);
            auVar72 = vminps_avx(auVar24,auVar68);
            auVar64 = vminps_avx(auVar64,auVar72);
            auVar74 = vmaxps_avx(auVar74,auVar82);
            auVar82 = vmaxps_avx(auVar24,auVar68);
            auVar74 = vmaxps_avx(auVar74,auVar82);
            auVar80 = vmaxss_avx(auVar80,ZEXT816(0) << 0x20);
            auVar82 = vshufps_avx(auVar80,auVar80,0);
            auVar80 = ZEXT416((uint)(1.0 - auVar80._0_4_));
            auVar80 = vshufps_avx(auVar80,auVar80,0);
            auVar81._0_4_ = fVar109 * auVar80._0_4_ + auVar76._0_4_ * auVar82._0_4_;
            auVar81._4_4_ = fVar112 * auVar80._4_4_ + auVar76._4_4_ * auVar82._4_4_;
            auVar81._8_4_ = fVar113 * auVar80._8_4_ + auVar76._8_4_ * auVar82._8_4_;
            auVar81._12_4_ = fVar114 * auVar80._12_4_ + auVar76._12_4_ * auVar82._12_4_;
            auVar97._0_4_ = fVar94 * auVar80._0_4_ + auVar82._0_4_ * auVar75._0_4_;
            auVar97._4_4_ = fVar95 * auVar80._4_4_ + auVar82._4_4_ * auVar75._4_4_;
            auVar97._8_4_ = fVar96 * auVar80._8_4_ + auVar82._8_4_ * auVar75._8_4_;
            auVar97._12_4_ = fVar108 * auVar80._12_4_ + auVar82._12_4_ * auVar75._12_4_;
            auVar80 = vmaxss_avx(ZEXT416((uint)(fVar91 - fVar98)),ZEXT816(0) << 0x20);
            auVar82 = vshufps_avx(auVar80,auVar80,0);
            auVar80 = ZEXT416((uint)(1.0 - auVar80._0_4_));
            auVar80 = vshufps_avx(auVar80,auVar80,0);
            auVar87._0_4_ = auVar80._0_4_ * fVar117 + auVar64._0_4_ * auVar82._0_4_;
            auVar87._4_4_ = auVar80._4_4_ * fVar23 + auVar64._4_4_ * auVar82._4_4_;
            auVar87._8_4_ = auVar80._8_4_ * fVar21 + auVar64._8_4_ * auVar82._8_4_;
            auVar87._12_4_ = auVar80._12_4_ * fVar22 + auVar64._12_4_ * auVar82._12_4_;
            auVar93._0_4_ = auVar80._0_4_ * fVar103 + auVar82._0_4_ * auVar74._0_4_;
            auVar93._4_4_ = auVar80._4_4_ * fVar88 + auVar82._4_4_ * auVar74._4_4_;
            auVar93._8_4_ = auVar80._8_4_ * fVar89 + auVar82._8_4_ * auVar74._8_4_;
            auVar93._12_4_ = auVar80._12_4_ * fVar90 + auVar82._12_4_ * auVar74._12_4_;
            uVar56 = iVar6 + 1;
            if ((int)uVar34 <= (int)uVar56) goto LAB_01405690;
            plVar59 = (long *)(lVar19 + (ulong)uVar56 * 0x38 + 0x10);
            auVar80 = ZEXT816(0) << 0x20;
            do {
              auVar101._0_4_ = ((float)(int)uVar56 / fVar4 - fVar84) / (fVar63 - fVar84);
              auVar101._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar74 = vshufps_avx(auVar101,auVar101,0);
              fVar88 = auVar87._4_4_;
              fVar89 = auVar87._8_4_;
              fVar90 = auVar87._12_4_;
              auVar82 = vshufps_avx(ZEXT416((uint)(1.0 - auVar101._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar101._0_4_)),0);
              fVar23 = auVar81._4_4_;
              fVar21 = auVar81._8_4_;
              fVar91 = auVar81._12_4_;
              auVar107._0_4_ = auVar87._0_4_ * auVar74._0_4_ + auVar82._0_4_ * auVar81._0_4_;
              auVar107._4_4_ = fVar88 * auVar74._4_4_ + auVar82._4_4_ * fVar23;
              auVar107._8_4_ = fVar89 * auVar74._8_4_ + auVar82._8_4_ * fVar21;
              auVar107._12_4_ = fVar90 * auVar74._12_4_ + auVar82._12_4_ * fVar91;
              fVar94 = auVar93._4_4_;
              fVar95 = auVar93._8_4_;
              fVar96 = auVar93._12_4_;
              fVar98 = auVar97._4_4_;
              fVar22 = auVar97._8_4_;
              fVar103 = auVar97._12_4_;
              auVar102._0_4_ = auVar82._0_4_ * auVar97._0_4_ + auVar93._0_4_ * auVar74._0_4_;
              auVar102._4_4_ = auVar82._4_4_ * fVar98 + fVar94 * auVar74._4_4_;
              auVar102._8_4_ = auVar82._8_4_ * fVar22 + fVar95 * auVar74._8_4_;
              auVar102._12_4_ = auVar82._12_4_ * fVar103 + fVar96 * auVar74._12_4_;
              lVar36 = plVar59[-2];
              lVar19 = *plVar59;
              auVar74 = *(undefined1 (*) [16])(lVar36 + lVar19 * uVar61);
              auVar82 = *(undefined1 (*) [16])(lVar36 + lVar19 * uVar54);
              auVar24 = *(undefined1 (*) [16])(lVar36 + lVar19 * uVar52);
              auVar68 = *(undefined1 (*) [16])(lVar36 + lVar19 * uVar60);
              auVar75 = vminps_avx(auVar74,auVar82);
              auVar76 = vminps_avx(auVar24,auVar68);
              auVar75 = vminps_avx(auVar75,auVar76);
              auVar75 = vsubps_avx(auVar75,auVar107);
              auVar74 = vmaxps_avx(auVar74,auVar82);
              auVar82 = vmaxps_avx(auVar24,auVar68);
              auVar74 = vmaxps_avx(auVar74,auVar82);
              auVar82 = vsubps_avx(auVar74,auVar102);
              auVar74 = vminps_avx(auVar75,auVar80);
              auVar81._0_4_ = auVar74._0_4_ + auVar81._0_4_;
              auVar81._4_4_ = auVar74._4_4_ + fVar23;
              auVar81._8_4_ = auVar74._8_4_ + fVar21;
              auVar81._12_4_ = auVar74._12_4_ + fVar91;
              auVar87._0_4_ = auVar74._0_4_ + auVar87._0_4_;
              auVar87._4_4_ = auVar74._4_4_ + fVar88;
              auVar87._8_4_ = auVar74._8_4_ + fVar89;
              auVar87._12_4_ = auVar74._12_4_ + fVar90;
              auVar74 = vmaxps_avx(auVar82,auVar80);
              auVar97._0_4_ = auVar97._0_4_ + auVar74._0_4_;
              auVar97._4_4_ = fVar98 + auVar74._4_4_;
              auVar97._8_4_ = fVar22 + auVar74._8_4_;
              auVar97._12_4_ = fVar103 + auVar74._12_4_;
              auVar93._0_4_ = auVar93._0_4_ + auVar74._0_4_;
              auVar93._4_4_ = fVar94 + auVar74._4_4_;
              auVar93._8_4_ = fVar95 + auVar74._8_4_;
              auVar93._12_4_ = fVar96 + auVar74._12_4_;
              uVar56 = uVar56 + 1;
              plVar59 = plVar59 + 7;
            } while (uVar34 != uVar56);
          }
          auVar118 = ZEXT1664(auVar80);
          auVar67 = vminps_avx(auVar67,auVar81);
          auVar79 = vmaxps_avx(auVar79,auVar97);
          auVar70 = vminps_avx(auVar70,auVar87);
          auVar65 = vmaxps_avx(auVar65,auVar93);
          lVar38 = lVar38 + 1;
          auVar115 = ZEXT1664(ZEXT816(0) << 0x40);
        } while (lVar38 != 4);
        local_1e28 = vmaxps_avx(local_1e28,auVar65);
        local_1d88 = vminps_avx(local_1d88,auVar70);
        local_1e18 = vmaxps_avx(local_1e18,auVar79);
        auVar69 = vminps_avx(auVar69,auVar67);
        local_1e40 = local_1e40 + 1;
      } while (local_1e40 != uVar40 + (uVar40 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar42 | (ulong)pcVar58 | 8;
    *(undefined1 (*) [16])(__return_storage_ptr__->lbounds).bounds0.lower.field_0.m128 = auVar69;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e18._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d88._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1e28._8_8_;
    __return_storage_ptr__->dt = BStack_1830;
    return __return_storage_ptr__;
  }
  lVar35 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_17d4 + lVar35) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffe834 + lVar35) = 0;
    lVar35 = lVar35 + 0xf0;
  } while (lVar35 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  geomID.field_0.v[0] = uVar40;
  local_1758 = uVar57;
  uStack_1750 = uVar60;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar8;
  local_1718._8_8_ = geomID.field_0.v[1];
  local_1708[0] = local_17b8._0_8_;
  local_1708[2] = local_17a8._0_8_;
  local_1708[3] = local_17a8._8_8_;
  local_16e8 = auStack_1798._0_8_;
  uStack_16e0 = auStack_1798._8_8_;
  local_840 = BVar8;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1b48 = (undefined1 (*) [16])&sStack_1ab8;
  local_1e08._8_4_ = 0x7f800000;
  local_1e08._0_8_ = 0x7f8000007f800000;
  local_1e08._12_4_ = 0x7f800000;
  local_1dd8._8_4_ = 0xff800000;
  local_1dd8._0_8_ = 0xff800000ff800000;
  local_1dd8._12_4_ = 0xff800000;
  uVar57 = 0;
  local_17b8._0_8_ = sVar44;
  local_17b8._8_8_ = uVar5;
  local_17a8._0_8_ = uVar25;
  local_17a8._8_8_ = uVar26;
  auStack_1798 = (undefined1  [16])aVar28;
  local_1788 = (undefined1  [16])local_1da8;
  local_1778 = aVar30;
  local_1768 = (undefined1  [16])aVar29;
  do {
    if (local_848 == 0) {
      uVar60 = 0xffffffffffffffff;
    }
    else {
      uVar60 = 0xffffffffffffffff;
      puVar50 = &local_1758;
      uVar42 = 0;
      uVar52 = 0;
      do {
        uVar54 = puVar50[1] - *puVar50;
        if ((((this->cfg).maxLeafSize < uVar54) || (1 < *(uint *)((long)(puVar50 + 9) + 4))) ||
           (bVar51 != 0)) {
          if (uVar42 < uVar54) {
            uVar60 = uVar52;
            uVar42 = uVar54;
          }
          bVar51 = 0;
        }
        uVar52 = uVar52 + 1;
        puVar50 = puVar50 + 0x1e;
      } while (local_848 != uVar52);
    }
    if (uVar60 != 0xffffffffffffffff) {
      lVar35 = uVar60 * 0xf0;
      v0.field_0.v[0] = uVar40 + 1;
      local_1b88 = 0xffffffff7f800000;
      sStack_1b80 = 0;
      v1.field_0.v[0] = uVar40 + 1;
      local_1a88 = 0xffffffff7f800000;
      sStack_1a80 = 0;
      pSVar3 = (Split *)(local_1718 + uVar60 * 0xf0);
      iVar6 = *(int *)((long)local_1708 + lVar35 + -4);
      local_1da8._0_8_ = uVar57;
      if (iVar6 == 0) {
        BVar8 = *(BBox1f *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        sVar44 = *(size_t *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        v2.field_0.i[2] = 0x7f800000;
        v2.field_0.v[0] = 0x7f8000007f800000;
        v2.field_0.i[3] = 0x7f800000;
        aStack_1cd8.m128[0] = -INFINITY;
        aStack_1cd8.m128[1] = -INFINITY;
        aStack_1cd8.m128[2] = -INFINITY;
        aStack_1cd8.m128[3] = -INFINITY;
        local_1cc8.i[0] = 0x7f800000;
        local_1cc8.i[1] = 0x7f800000;
        local_1cc8.i[2] = 0x7f800000;
        local_1cc8.i[3] = 0x7f800000;
        aStack_1cb8.i[0] = -0x800000;
        aStack_1cb8.i[1] = -0x800000;
        aStack_1cb8.i[2] = -0x800000;
        aStack_1cb8.i[3] = -0x800000;
        local_1ca8.m128[0] = INFINITY;
        local_1ca8.m128[1] = INFINITY;
        local_1ca8.m128[2] = INFINITY;
        local_1ca8.m128[3] = INFINITY;
        aStack_1c98.m128[0] = -INFINITY;
        aStack_1c98.m128[1] = -INFINITY;
        aStack_1c98.m128[2] = -INFINITY;
        aStack_1c98.m128[3] = -INFINITY;
        local_1c68 = 0.0;
        local_1c88.lower = 0.0;
        local_1c88.upper = 0.0;
        sStack_1c80 = 0;
        sStack_1c78 = 0;
        sStack_1c70 = 0;
        auVar85._8_4_ = 0x3f800000;
        auVar85._0_8_ = &DAT_3f8000003f800000;
        auVar85._12_4_ = 0x3f800000;
        lVar38 = vmovlps_avx(auVar85);
        fStack_1c64 = (float)lVar38;
        fStack_1c60 = (float)((ulong)lVar38 >> 0x20);
        fStack_1c5c = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar5 = vmovlps_avx(auVar85);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = (int)local_1708[uVar60 * 0x1e + -1];
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar36 = (long)(1 << (local_1718[lVar35 + 4] & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar36);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar36 + 8);
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        isLeft.split = pSVar3;
        sStack_1bc0 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar60 * 0x1e] + 0x20),
                                 (size_t)BVar8,sVar44,(EmptyTy *)local_19e8,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                 &reduction,&reduction2,0x80,0xc00);
        auVar65 = auStack_1ba8;
        local_1b98 = local_1728[uVar60 * 0x1e];
        auVar64._8_8_ = 0;
        auVar64._0_4_ = local_1728[uVar60 * 0x1e + -1].lower;
        auVar64._4_4_ = local_1728[uVar60 * 0x1e + -1].upper;
        auStack_1c18._0_4_ = -INFINITY;
        auStack_1c18._4_4_ = -INFINITY;
        auStack_1c18._8_4_ = -INFINITY;
        auStack_1c18._12_4_ = -INFINITY;
        local_1c08._0_4_ = INFINITY;
        local_1c08._4_4_ = INFINITY;
        local_1c08._8_4_ = INFINITY;
        local_1c08._12_4_ = INFINITY;
        aStack_1bf8.m128[0] = -INFINITY;
        aStack_1bf8.m128[1] = -INFINITY;
        aStack_1bf8.m128[2] = -INFINITY;
        aStack_1bf8.m128[3] = -INFINITY;
        local_1be8.m128[0] = INFINITY;
        local_1be8.m128[1] = INFINITY;
        local_1be8._8_8_ = 0x7f8000007f800000;
        aStack_1bd8._0_8_ = 0xff800000ff800000;
        aStack_1bd8._8_8_ = 0xff800000ff800000;
        local_1c28._0_8_ = v2.field_0.v[0];
        local_1c28._8_8_ = v2.field_0.v[1];
        sStack_1bb8 = 0;
        sStack_1bb0 = 0;
        auStack_1ba8._0_4_ = (float)(lVar38 << 0x20);
        auStack_1ba8._4_4_ = SUB84(lVar38 << 0x20,4);
        auStack_1ba8 = auVar65;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = auStack_1ba8._8_8_;
        auVar65 = vcmpps_avx(auVar72,auVar64,1);
        auVar67 = vinsertps_avx(auVar64,auVar72,0x50);
        auVar66 = vinsertps_avx(auVar72,auVar64,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        uVar5 = vmovlps_avx(auVar65);
        auStack_1ba8._8_8_ = uVar5;
        local_1b28._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b28._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        *(size_t *)local_1b48 = right.num_time_segments;
        *(size_t *)((long)local_1b48 + 8) = right.max_num_time_segments;
        *(size_t *)((long)local_1b48 + 0x10) =
             CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        *(size_t *)((long)local_1b48 + 0x18) =
             CONCAT44(right.time_range.upper,right.time_range.lower);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = auStack_1aa8._8_8_;
        auVar65 = vcmpps_avx(auVar73,auVar64,1);
        auVar67 = vinsertps_avx(auVar64,auVar73,0x50);
        auVar66 = vinsertps_avx(auVar73,auVar64,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        uVar5 = vmovlps_avx(auVar65);
        auStack_1aa8._8_8_ = uVar5;
        local_1bc8 = BVar8;
        local_1ac8 = sStack_1bc0;
        sStack_1ac0 = sVar44;
        local_1a98 = local_1b98;
LAB_0140384a:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_01 = &local_17b8 + uVar60 * 0xf;
        if (iVar6 != 2) {
          if (iVar6 == 1) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitFallback(this,(SetMB *)&this_01->field_1,(SetMB *)local_1c28,
                          (SetMB *)&local_1b28.field_1);
          }
          else if (iVar6 == 3) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitByGeometry(this,(SetMB *)&this_01->field_1,(SetMB *)local_1c28,
                            (SetMB *)&local_1b28.field_1);
          }
          goto LAB_0140384a;
        }
        time_range1.lower = *(float *)(local_1708 + uVar60 * 0x1e + -1);
        time_range0.lower = local_1728[uVar60 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar60 * 0x1e + -1].upper;
        BVar8 = local_1728[uVar60 * 0x1e];
        time_range0.upper = time_range1.lower;
        BVar37 = (BBox1f)operator_new(0x28);
        pMVar9 = (this->heuristicTemporalSplit).device;
        lVar38 = *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        *(MemoryMonitorInterface **)BVar37 = pMVar9;
        *(undefined1 *)((long)BVar37 + 8) = 0;
        *(long *)((long)BVar37 + 0x10) = 0;
        *(long *)((long)BVar37 + 0x18) = 0;
        *(long *)((long)BVar37 + 0x20) = 0;
        lVar38 = lVar38 - *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        if (lVar38 != 0) {
          uVar42 = lVar38 * 0x50;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar42,0);
          if (uVar42 < 0x1c00000) {
            pvVar39 = alignedMalloc(uVar42,0x10);
          }
          else {
            pvVar39 = os_malloc(uVar42,(bool *)((long)BVar37 + 8));
          }
          *(void **)((long)BVar37 + 0x20) = pvVar39;
          *(long *)((long)BVar37 + 0x10) = lVar38;
          *(long *)((long)BVar37 + 0x18) = lVar38;
        }
        pvVar32 = isLeft.vSplitPos;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar10 = *(Split **)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        pvVar11 = *(vint **)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar65._8_4_ = 0x3f800000;
        auVar65._0_8_ = &DAT_3f8000003f800000;
        auVar65._12_4_ = 0x3f800000;
        uVar5 = vmovlps_avx(auVar65);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )BVar37;
        vSplitMask.field_0._0_8_ = BVar8;
        if ((ulong)((long)pvVar11 - (long)pSVar10) < 0xc00) {
          isLeft.split = pSVar10;
          isLeft.vSplitPos = pvVar11;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&v2,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar32,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar11;
          vSplitPos.field_0.v[1] = (longlong)pSVar10;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&v2,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar33 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar33 != '\0') {
            prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar46,"task cancelled");
            __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (sStack_1c80 - (long)local_1c88 !=
            *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
            *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8)) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          sStack_1c80 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                  (*(PrimRefMB **)((long)BVar37 + 0x20),0,
                                   *(long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
                                   *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8),0x400,
                                   (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar5 = vSplitPos.field_0.v[1];
        auVar66._4_4_ = time_range0.upper;
        auVar66._0_4_ = time_range0.lower;
        auVar66._8_8_ = 0;
        auStack_1c18._4_4_ = aStack_1cd8.m128[1];
        auStack_1c18._0_4_ = aStack_1cd8.m128[0];
        auStack_1c18._12_4_ = aStack_1cd8.m128[3];
        auStack_1c18._8_4_ = aStack_1cd8.m128[2];
        local_1c08._4_4_ = local_1cc8.i[1];
        local_1c08._0_4_ = local_1cc8.i[0];
        local_1c08._12_4_ = local_1cc8.i[3];
        local_1c08._8_4_ = local_1cc8.i[2];
        aStack_1bf8.m128[1] = (float)aStack_1cb8.i[1];
        aStack_1bf8.m128[0] = (float)aStack_1cb8.i[0];
        aStack_1bf8.m128[3] = (float)aStack_1cb8.i[3];
        aStack_1bf8.m128[2] = (float)aStack_1cb8.i[2];
        local_1be8.m128[1] = local_1ca8.m128[1];
        local_1be8.m128[0] = local_1ca8.m128[0];
        local_1be8._8_8_ = CONCAT44(local_1ca8.m128[3],local_1ca8.m128[2]);
        aStack_1bd8._0_8_ = CONCAT44(aStack_1c98.m128[1],aStack_1c98.m128[0]);
        aStack_1bd8._8_8_ = CONCAT44(aStack_1c98.m128[3],aStack_1c98.m128[2]);
        sStack_1bb8 = sStack_1c78;
        sStack_1bb0 = sStack_1c70;
        local_1c28._0_8_ = v2.field_0.v[0];
        local_1c28._8_8_ = v2.field_0.v[1];
        local_1bc8 = local_1c88;
        sStack_1bc0 = sStack_1c80;
        auVar74._4_4_ = fStack_1c64;
        auVar74._0_4_ = local_1c68;
        auVar74._8_8_ = 0;
        auVar82._4_4_ = fStack_1c5c;
        auVar82._0_4_ = fStack_1c60;
        auVar82._8_8_ = 0;
        auVar65 = vcmpps_avx(auVar82,auVar66,1);
        auVar67 = vinsertps_avx(auVar66,auVar82,0x50);
        auVar66 = vinsertps_avx(auVar82,auVar66,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        auStack_1ba8 = vmovlhps_avx(auVar74,auVar65);
        pcVar12 = *(code **)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8);
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar67._8_4_ = 0x3f800000;
        auVar67._0_8_ = &DAT_3f8000003f800000;
        auVar67._12_4_ = 0x3f800000;
        vmovlps_avx(auVar67);
        local_1b98 = BVar37;
        _reduction2 = BVar8;
        if ((ulong)((long)pcVar12 - *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8)) < 0xc00) {
          vSplitPos.field_0.v[0] = *(long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
          vSplitPos.field_0.v[1] = (longlong)pcVar12;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar5,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19e8._8_8_ = &reduction2;
          _reduction = pcVar12;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar33 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar33 != '\0') {
            prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar46,"task cancelled");
            __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar38 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8);
        right.object_range._end = lVar38 + right.object_range._begin;
        if (lVar38 != *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) -
                      right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar8 + 0x20),right.object_range._begin,
                          *(unsigned_long *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8),0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar68._4_4_ = time_range1.upper;
        auVar68._0_4_ = time_range1.lower;
        auVar68._8_8_ = 0;
        local_1b28._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b28._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        auVar24._8_8_ = right.max_num_time_segments;
        auVar24._0_8_ = right.num_time_segments;
        *local_1b48 = auVar24;
        local_1ac8 = right.object_range._begin;
        sStack_1ac0 = right.object_range._end;
        auVar75._4_4_ = right.time_range.upper;
        auVar75._0_4_ = right.time_range.lower;
        auVar75._8_8_ = 0;
        auVar65 = vcmpps_avx(auVar75,auVar68,1);
        auVar67 = vinsertps_avx(auVar68,auVar75,0x50);
        auVar66 = vinsertps_avx(auVar75,auVar68,0x50);
        auVar65 = vblendvps_avx(auVar66,auVar67,auVar65);
        auVar76._4_4_ = right.max_time_range.upper;
        auVar76._0_4_ = right.max_time_range.lower;
        auVar76._8_8_ = 0;
        auStack_1aa8 = vmovlhps_avx(auVar76,auVar65);
        local_1a98 = BVar8;
      }
      bVar62 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&v2,this,(SetMB *)local_1c28);
      local_1b78 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
      local_1b68 = CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      sStack_1b60 = CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      sStack_1b58 = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      sStack_1b50 = CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      findFallback((Split *)&v2,this,(SetMB *)&local_1b28.field_1);
      lVar38 = local_640;
      local_1a78 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
      local_1a68 = CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      sStack_1a60 = CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      sStack_1a58 = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      sStack_1a50 = CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar47 = local_8c8[uVar60];
      if (local_1b98 == *pBVar47) {
        pBVar47[1] = (BBox1f)((long)pBVar47[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1b98;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[uVar60] = local_838 + lVar38 * 2 + -1;
      }
      lVar38 = local_640;
      if (local_1a98 == *pBVar47) {
        local_8c8[local_848] = pBVar47;
        pBVar47[1] = (BBox1f)((long)pBVar47[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1a98;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar38 * 2 + -1;
      }
      pBVar15 = pBVar47 + 1;
      *pBVar15 = (BBox1f)((long)*pBVar15 + -1);
      if ((*pBVar15 == (BBox1f)0x0) && (BVar8 = *pBVar47, BVar8 != (BBox1f)0x0)) {
        lVar38 = *(long *)((long)BVar8 + 0x18);
        pvVar39 = *(void **)((long)BVar8 + 0x20);
        if (pvVar39 != (void *)0x0) {
          if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
            alignedFree(pvVar39);
          }
          else {
            os_free(pvVar39,lVar38 * 0x50,*(bool *)((long)BVar8 + 8));
          }
        }
        if (lVar38 != 0) {
          (**(code **)**(undefined8 **)BVar8)(*(undefined8 **)BVar8,lVar38 * -0x50,1);
        }
        *(undefined8 *)((long)BVar8 + 0x10) = 0;
        *(undefined8 *)((long)BVar8 + 0x18) = 0;
        *(undefined8 *)((long)BVar8 + 0x20) = 0;
        operator_delete((void *)BVar8);
      }
      uVar42 = local_848;
      auVar67 = auStack_1aa8;
      auVar65 = auStack_1ba8;
      (&geomID)[uVar60 * 0xf].field_0.v[0] = v0.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar60 * 0xf) = local_1c28._0_8_;
      *(undefined8 *)(local_17a8 + uVar60 * 0xf0 + -8) = local_1c28._8_8_;
      ((BBox1f *)(local_17a8 + uVar60 * 0xf0))->lower = (float)auStack_1c18._0_4_;
      ((BBox1f *)(local_17a8 + uVar60 * 0xf0))->upper = (float)auStack_1c18._4_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + -8))->lower = (float)auStack_1c18._8_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + -8))->upper = (float)auStack_1c18._12_4_;
      ((BBox1f *)(auStack_1798 + lVar35))->lower = (float)local_1c08._0_4_;
      ((BBox1f *)(auStack_1798 + lVar35))->upper = (float)local_1c08._4_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + 8))->lower = (float)local_1c08._8_4_;
      ((BBox1f *)(auStack_1798 + lVar35 + 8))->upper = (float)local_1c08._12_4_;
      ((BBox1f *)(local_1788 + lVar35))->lower = (float)aStack_1bf8._0_4_;
      ((BBox1f *)(local_1788 + lVar35))->upper = aStack_1bf8.m128[1];
      ((BBox1f *)(local_1788 + lVar35 + 8))->lower = (float)aStack_1bf8._8_4_;
      ((BBox1f *)(local_1788 + lVar35 + 8))->upper = aStack_1bf8.m128[3];
      *(undefined8 *)(&local_1778 + uVar60 * 0xf) = local_1be8._0_8_;
      *(undefined8 *)((long)&local_1778 + lVar35 + 8) = local_1be8._8_8_;
      *(undefined8 *)(local_1768 + uVar60 * 0xf0) = aStack_1bd8._0_8_;
      *(undefined8 *)(local_1768 + uVar60 * 0xf0 + 8) = aStack_1bd8._8_8_;
      *(BBox1f *)(local_1768 + (uVar60 * 0x1e + 1) * 8 + 8) = local_1bc8;
      *(size_t *)(local_1768 + (uVar60 * 0x1e + 2) * 8 + 8) = sStack_1bc0;
      asStack_1748[uVar60 * 0x1e] = sStack_1bb8;
      asStack_1748[uVar60 * 0x1e + 1] = sStack_1bb0;
      (&local_1738)[uVar60 * 0x1e].lower = (float)auStack_1ba8._0_4_;
      (&local_1738)[uVar60 * 0x1e].upper = (float)auStack_1ba8._4_4_;
      local_1728[uVar60 * 0x1e + -1].lower = (float)auStack_1ba8._8_4_;
      local_1728[uVar60 * 0x1e + -1].upper = (float)auStack_1ba8._12_4_;
      local_1728[uVar60 * 0x1e] = local_1b98;
      pSVar3->sah = (float)(undefined4)local_1b88;
      pSVar3->dim = local_1b88._4_4_;
      local_1708[uVar60 * 0x1e + -1] = sStack_1b80;
      local_1708[uVar60 * 0x1e] = local_1b78;
      local_1708[uVar60 * 0x1e + 2] = local_1b68;
      local_1708[uVar60 * 0x1e + 3] = sStack_1b60;
      local_1708[uVar60 * 0x1e + 4] = sStack_1b58;
      local_1708[uVar60 * 0x1e + 5] = sStack_1b50;
      lVar35 = local_848 * 0xf0;
      (&geomID)[local_848 * 0xf].field_0.v[0] = v1.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar42 * 0xf) = local_1b28._0_8_;
      *(undefined8 *)(local_17a8 + uVar42 * 0xf0 + -8) = local_1b28._8_8_;
      *(undefined8 *)(local_17a8 + uVar42 * 0xf0) = uStack_1b18;
      *(undefined8 *)(auStack_1798 + lVar35 + -8) = uStack_1b10;
      *(undefined8 *)(auStack_1798 + lVar35) = local_1b08;
      *(undefined8 *)(auStack_1798 + lVar35 + 8) = uStack_1b00;
      *(undefined8 *)(local_1788 + lVar35) = uStack_1af8;
      *(undefined8 *)(local_1788 + lVar35 + 8) = uStack_1af0;
      *(undefined8 *)(&local_1778 + uVar42 * 0xf) = local_1ae8;
      *(undefined8 *)((long)&local_1778 + lVar35 + 8) = uStack_1ae0;
      *(undefined8 *)(local_1768 + uVar42 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1768 + uVar42 * 0xf0 + 8) = uStack_1ad0;
      *(size_t *)(local_1768 + (uVar42 * 0x1e + 1) * 8 + 8) = local_1ac8;
      *(size_t *)(local_1768 + (uVar42 * 0x1e + 2) * 8 + 8) = sStack_1ac0;
      asStack_1748[uVar42 * 0x1e] = sStack_1ab8;
      asStack_1748[uVar42 * 0x1e + 1] = sStack_1ab0;
      (&local_1738)[uVar42 * 0x1e].lower = (float)auStack_1aa8._0_4_;
      (&local_1738)[uVar42 * 0x1e].upper = (float)auStack_1aa8._4_4_;
      local_1728[uVar42 * 0x1e + -1].lower = (float)auStack_1aa8._8_4_;
      local_1728[uVar42 * 0x1e + -1].upper = (float)auStack_1aa8._12_4_;
      local_1728[uVar42 * 0x1e] = local_1a98;
      *(undefined8 *)(local_1718 + uVar42 * 0xf0) = local_1a88;
      local_1708[uVar42 * 0x1e + -1] = sStack_1a80;
      local_1708[uVar42 * 0x1e] = local_1a78;
      local_1708[uVar42 * 0x1e + 2] = local_1a68;
      local_1708[uVar42 * 0x1e + 3] = sStack_1a60;
      local_1708[uVar42 * 0x1e + 4] = sStack_1a58;
      local_1708[uVar42 * 0x1e + 5] = sStack_1a50;
      local_848 = local_848 + 1;
      auStack_1ba8 = auVar65;
      auStack_1aa8 = auVar67;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      uVar57 = (ulong)(byte)((byte)uVar57 | bVar62);
    }
  } while ((uVar60 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar48 = &uStack_172c;
    uVar40 = local_848;
    do {
      auVar65 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar48[-1]),1);
      auVar67 = vcmpps_avx(ZEXT416(*puVar48),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar65 = vorps_avx(auVar65,auVar67);
      uVar57 = (ulong)(byte)((byte)uVar57 | auVar65[0]);
      puVar48 = puVar48 + 0x3c;
      uVar40 = uVar40 - 1;
    } while (uVar40 != 0);
  }
  local_1da8._0_8_ = uVar57;
  if ((uVar57 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar71._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar71._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar71._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar71._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar71._0_8_;
      (pTVar13->alloc0).cur = auVar71._8_8_;
      (pTVar13->alloc0).end = auVar71._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar71._24_8_;
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar71._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar13->alloc1).cur = auVar71._8_8_;
        (pTVar13->alloc1).end = auVar71._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar71._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar13->alloc1).cur = auVar71._8_8_;
        (pTVar13->alloc1).end = auVar71._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar71._24_8_;
        (pTVar13->alloc1).end = auVar71._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pTVar13;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar14._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar14._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (v0.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
      }
      if (v1.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar44 = (alloc.talloc0)->cur;
    uVar40 = (ulong)(-(int)sVar44 & 0xf);
    uVar57 = sVar44 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar40;
    (alloc.talloc0)->cur = uVar57;
    if ((alloc.talloc0)->end < uVar57) {
      (alloc.talloc0)->cur = sVar44;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar58;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar58;
          sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar44;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar58 = (char *)0x0;
            goto LAB_0140496a;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
      pcVar58 = (alloc.talloc0)->ptr +
                (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_0140496a:
    uVar40 = 1;
    goto LAB_01404970;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar13->alloc0).end = auVar71._0_8_;
    (pTVar13->alloc0).allocBlockSize = auVar71._8_8_;
    (pTVar13->alloc0).bytesUsed = auVar71._16_8_;
    (pTVar13->alloc0).bytesWasted = auVar71._24_8_;
    (pTVar13->alloc0).ptr = (char *)auVar71._0_8_;
    (pTVar13->alloc0).cur = auVar71._8_8_;
    (pTVar13->alloc0).end = auVar71._16_8_;
    (pTVar13->alloc0).allocBlockSize = auVar71._24_8_;
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).end = auVar71._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar13->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar13->alloc1).cur = auVar71._8_8_;
      (pTVar13->alloc1).end = auVar71._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar71._24_8_;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar13->alloc1).cur = auVar71._8_8_;
      (pTVar13->alloc1).end = auVar71._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar71._24_8_;
      (pTVar13->alloc1).end = auVar71._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)pTVar13;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar14._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&v2);
    }
    else {
      *iVar14._M_current = (ThreadLocal2 *)v2.field_0.v[0];
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (v0.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
    }
    if (v1.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar44 = (alloc.talloc0)->cur;
  uVar40 = (ulong)(-(int)sVar44 & 0xf);
  uVar57 = sVar44 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar40;
  (alloc.talloc0)->cur = uVar57;
  if ((alloc.talloc0)->end < uVar57) {
    (alloc.talloc0)->cur = sVar44;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar58;
      sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar44;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar58 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar58;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar58 = (char *)0x0;
          goto LAB_014048c3;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar44;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
    pcVar58 = (alloc.talloc0)->ptr +
              (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_014048c3:
  pcVar58[0xe0] = '\0';
  pcVar58[0xe1] = '\0';
  pcVar58[0xe2] = -0x80;
  pcVar58[0xe3] = '\x7f';
  pcVar58[0xe4] = '\0';
  pcVar58[0xe5] = '\0';
  pcVar58[0xe6] = -0x80;
  pcVar58[0xe7] = '\x7f';
  pcVar58[0xe8] = '\0';
  pcVar58[0xe9] = '\0';
  pcVar58[0xea] = -0x80;
  pcVar58[0xeb] = '\x7f';
  pcVar58[0xec] = '\0';
  pcVar58[0xed] = '\0';
  pcVar58[0xee] = -0x80;
  pcVar58[0xef] = '\x7f';
  pcVar58[0xf0] = '\0';
  pcVar58[0xf1] = '\0';
  pcVar58[0xf2] = -0x80;
  pcVar58[0xf3] = -1;
  pcVar58[0xf4] = '\0';
  pcVar58[0xf5] = '\0';
  pcVar58[0xf6] = -0x80;
  pcVar58[0xf7] = -1;
  pcVar58[0xf8] = '\0';
  pcVar58[0xf9] = '\0';
  pcVar58[0xfa] = -0x80;
  pcVar58[0xfb] = -1;
  pcVar58[0xfc] = '\0';
  pcVar58[0xfd] = '\0';
  pcVar58[0xfe] = -0x80;
  pcVar58[0xff] = -1;
  uVar40 = 6;
LAB_01404970:
  in_00 = (BuildRecord *)&geomID;
  pcVar58[0x60] = '\0';
  pcVar58[0x61] = '\0';
  pcVar58[0x62] = -0x80;
  pcVar58[99] = '\x7f';
  pcVar58[100] = '\0';
  pcVar58[0x65] = '\0';
  pcVar58[0x66] = -0x80;
  pcVar58[0x67] = '\x7f';
  pcVar58[0x68] = '\0';
  pcVar58[0x69] = '\0';
  pcVar58[0x6a] = -0x80;
  pcVar58[0x6b] = '\x7f';
  pcVar58[0x6c] = '\0';
  pcVar58[0x6d] = '\0';
  pcVar58[0x6e] = -0x80;
  pcVar58[0x6f] = '\x7f';
  pcVar58[0x40] = '\0';
  pcVar58[0x41] = '\0';
  pcVar58[0x42] = -0x80;
  pcVar58[0x43] = '\x7f';
  pcVar58[0x44] = '\0';
  pcVar58[0x45] = '\0';
  pcVar58[0x46] = -0x80;
  pcVar58[0x47] = '\x7f';
  pcVar58[0x48] = '\0';
  pcVar58[0x49] = '\0';
  pcVar58[0x4a] = -0x80;
  pcVar58[0x4b] = '\x7f';
  pcVar58[0x4c] = '\0';
  pcVar58[0x4d] = '\0';
  pcVar58[0x4e] = -0x80;
  pcVar58[0x4f] = '\x7f';
  pcVar58[0x20] = '\0';
  pcVar58[0x21] = '\0';
  pcVar58[0x22] = -0x80;
  pcVar58[0x23] = '\x7f';
  pcVar58[0x24] = '\0';
  pcVar58[0x25] = '\0';
  pcVar58[0x26] = -0x80;
  pcVar58[0x27] = '\x7f';
  pcVar58[0x28] = '\0';
  pcVar58[0x29] = '\0';
  pcVar58[0x2a] = -0x80;
  pcVar58[0x2b] = '\x7f';
  pcVar58[0x2c] = '\0';
  pcVar58[0x2d] = '\0';
  pcVar58[0x2e] = -0x80;
  pcVar58[0x2f] = '\x7f';
  local_1e58._8_4_ = 0xff800000;
  local_1e58._0_8_ = 0xff800000ff800000;
  local_1e58._12_4_ = 0xff800000;
  *(undefined1 (*) [16])(pcVar58 + 0x70) = local_1e58;
  *(undefined1 (*) [16])(pcVar58 + 0x50) = local_1e58;
  *(undefined1 (*) [16])(pcVar58 + 0x30) = local_1e58;
  auVar65 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar58 + 0x80) = ZEXT1632(auVar65);
  *(undefined1 (*) [32])(pcVar58 + 0xa0) = ZEXT1632(auVar65);
  *(undefined1 (*) [32])(pcVar58 + 0xc0) = ZEXT1632(auVar65);
  pcVar58[0] = '\b';
  pcVar58[1] = '\0';
  pcVar58[2] = '\0';
  pcVar58[3] = '\0';
  pcVar58[4] = '\0';
  pcVar58[5] = '\0';
  pcVar58[6] = '\0';
  pcVar58[7] = '\0';
  pcVar58[8] = '\b';
  pcVar58[9] = '\0';
  pcVar58[10] = '\0';
  pcVar58[0xb] = '\0';
  pcVar58[0xc] = '\0';
  pcVar58[0xd] = '\0';
  pcVar58[0xe] = '\0';
  pcVar58[0xf] = '\0';
  pcVar58[0x10] = '\b';
  pcVar58[0x11] = '\0';
  pcVar58[0x12] = '\0';
  pcVar58[0x13] = '\0';
  pcVar58[0x14] = '\0';
  pcVar58[0x15] = '\0';
  pcVar58[0x16] = '\0';
  pcVar58[0x17] = '\0';
  pcVar58[0x18] = '\b';
  pcVar58[0x19] = '\0';
  pcVar58[0x1a] = '\0';
  pcVar58[0x1b] = '\0';
  pcVar58[0x1c] = '\0';
  pcVar58[0x1d] = '\0';
  pcVar58[0x1e] = '\0';
  pcVar58[0x1f] = '\0';
  local_1e38._8_4_ = 0x7f800000;
  local_1e38._0_8_ = 0x7f8000007f800000;
  local_1e38._12_4_ = 0x7f800000;
  if (local_848 != 0) {
    pBVar47 = &values[0].dt;
    uVar57 = 0;
    local_1e38._8_4_ = 0x7f800000;
    local_1e38._0_8_ = 0x7f8000007f800000;
    local_1e38._12_4_ = 0x7f800000;
    local_1e08._8_4_ = 0x7f800000;
    local_1e08._0_8_ = 0x7f8000007f800000;
    local_1e08._12_4_ = 0x7f800000;
    local_1e58._8_4_ = 0xff800000;
    local_1e58._0_8_ = 0xff800000ff800000;
    local_1e58._12_4_ = 0xff800000;
    local_1dd8._8_4_ = 0xff800000;
    local_1dd8._0_8_ = 0xff800000ff800000;
    local_1dd8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v0,this,in_00,alloc);
      vVar31 = v0;
      pBVar47[-10].lower = (float)v0.field_0.v[0]._0_4_;
      pBVar47[-10].upper = (float)v0.field_0._4_4_;
      auVar27._8_8_ = local_1c28._8_8_;
      auVar27._0_8_ = local_1c28._0_8_;
      *(undefined1 (*) [16])(pBVar47 + -8) = auVar27;
      pBVar47[-6].lower = (float)auStack_1c18._0_4_;
      pBVar47[-6].upper = (float)auStack_1c18._4_4_;
      pBVar47[-5].lower = (float)auStack_1c18._8_4_;
      pBVar47[-5].upper = (float)auStack_1c18._12_4_;
      pBVar47[-4].lower = (float)local_1c08._0_4_;
      pBVar47[-4].upper = (float)local_1c08._4_4_;
      pBVar47[-3].lower = (float)local_1c08._8_4_;
      pBVar47[-3].upper = (float)local_1c08._12_4_;
      pBVar47[-2].lower = (float)aStack_1bf8._0_4_;
      pBVar47[-2].upper = aStack_1bf8.m128[1];
      pBVar47[-1].lower = (float)aStack_1bf8._8_4_;
      pBVar47[-1].upper = aStack_1bf8.m128[3];
      pBVar47->lower = (float)local_1be8._0_4_;
      pBVar47->upper = local_1be8.m128[1];
      local_1e58 = vmaxps_avx(local_1e58,*(undefined1 (*) [16])(pBVar47 + -6));
      local_1e08 = vminps_avx(local_1e08,*(undefined1 (*) [16])(pBVar47 + -4));
      local_1e38 = vminps_avx(local_1e38,auVar27);
      local_1dd8 = vmaxps_avx(local_1dd8,*(undefined1 (*) [16])(pBVar47 + -2));
      uVar57 = uVar57 + 1;
      pBVar47 = pBVar47 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      v0 = vVar31;
    } while (uVar57 < local_848);
  }
  if (((uint)uVar40 | (uint)pcVar58 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar60 = (ulong)pcVar58 & 0xfffffffffffffff0;
      pfVar41 = &values[0].dt.upper;
      uVar57 = 0;
      auVar83._8_4_ = 0x7f7fffff;
      auVar83._0_8_ = 0x7f7fffff7f7fffff;
      auVar83._12_4_ = 0x7f7fffff;
      auVar86._8_4_ = 0xff7fffff;
      auVar86._0_8_ = 0xff7fffffff7fffff;
      auVar86._12_4_ = 0xff7fffff;
      auVar92._8_4_ = 0x7fffffff;
      auVar92._0_8_ = 0x7fffffff7fffffff;
      auVar92._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar60 + uVar57 * 8) = *(undefined8 *)(pfVar41 + -0x15);
        fVar4 = ((BBox1f *)(pfVar41 + -1))->lower;
        fVar98 = 1.0 / (*pfVar41 - fVar4);
        fVar23 = -fVar4 * fVar98;
        auVar65 = vshufps_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar23)),ZEXT416((uint)(1.0 - fVar23)),0);
        auVar116._0_4_ = pfVar41[-9] * auVar65._0_4_ + pfVar41[-0x11] * auVar67._0_4_;
        auVar116._4_4_ = pfVar41[-8] * auVar65._4_4_ + pfVar41[-0x10] * auVar67._4_4_;
        auVar116._8_4_ = pfVar41[-7] * auVar65._8_4_ + pfVar41[-0xf] * auVar67._8_4_;
        auVar116._12_4_ = pfVar41[-6] * auVar65._12_4_ + pfVar41[-0xe] * auVar67._12_4_;
        auVar104._0_4_ = pfVar41[-5] * auVar65._0_4_ + pfVar41[-0xd] * auVar67._0_4_;
        auVar104._4_4_ = pfVar41[-4] * auVar65._4_4_ + pfVar41[-0xc] * auVar67._4_4_;
        auVar104._8_4_ = pfVar41[-3] * auVar65._8_4_ + pfVar41[-0xb] * auVar67._8_4_;
        auVar104._12_4_ = pfVar41[-2] * auVar65._12_4_ + pfVar41[-10] * auVar67._12_4_;
        fVar98 = (1.0 - fVar4) * fVar98;
        auVar65 = vshufps_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),0);
        auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar98)),ZEXT416((uint)(1.0 - fVar98)),0);
        auVar106._0_4_ = pfVar41[-9] * auVar65._0_4_ + pfVar41[-0x11] * auVar67._0_4_;
        auVar106._4_4_ = pfVar41[-8] * auVar65._4_4_ + pfVar41[-0x10] * auVar67._4_4_;
        auVar106._8_4_ = pfVar41[-7] * auVar65._8_4_ + pfVar41[-0xf] * auVar67._8_4_;
        auVar106._12_4_ = pfVar41[-6] * auVar65._12_4_ + pfVar41[-0xe] * auVar67._12_4_;
        auVar99._0_4_ = pfVar41[-5] * auVar65._0_4_ + pfVar41[-0xd] * auVar67._0_4_;
        auVar99._4_4_ = pfVar41[-4] * auVar65._4_4_ + pfVar41[-0xc] * auVar67._4_4_;
        auVar99._8_4_ = pfVar41[-3] * auVar65._8_4_ + pfVar41[-0xb] * auVar67._8_4_;
        auVar99._12_4_ = pfVar41[-2] * auVar65._12_4_ + pfVar41[-10] * auVar67._12_4_;
        auVar80 = vminps_avx(auVar116,auVar83);
        auVar67 = vmaxps_avx(auVar104,auVar86);
        auVar74 = vminps_avx(auVar106,auVar83);
        auVar66 = vmaxps_avx(auVar99,auVar86);
        auVar65 = vandps_avx(auVar80,auVar92);
        auVar110._0_4_ = auVar65._0_4_ * 4.7683716e-07;
        auVar110._4_4_ = auVar65._4_4_ * 4.7683716e-07;
        auVar110._8_4_ = auVar65._8_4_ * 4.7683716e-07;
        auVar110._12_4_ = auVar65._12_4_ * 4.7683716e-07;
        auVar80 = vsubps_avx(auVar80,auVar110);
        auVar65 = vandps_avx(auVar67,auVar92);
        auVar105._0_4_ = auVar67._0_4_ + auVar65._0_4_ * 4.7683716e-07;
        auVar105._4_4_ = auVar67._4_4_ + auVar65._4_4_ * 4.7683716e-07;
        auVar105._8_4_ = auVar67._8_4_ + auVar65._8_4_ * 4.7683716e-07;
        auVar105._12_4_ = auVar67._12_4_ + auVar65._12_4_ * 4.7683716e-07;
        auVar65 = vandps_avx(auVar74,auVar92);
        auVar111._0_4_ = auVar65._0_4_ * 4.7683716e-07;
        auVar111._4_4_ = auVar65._4_4_ * 4.7683716e-07;
        auVar111._8_4_ = auVar65._8_4_ * 4.7683716e-07;
        auVar111._12_4_ = auVar65._12_4_ * 4.7683716e-07;
        auVar67 = vsubps_avx(auVar74,auVar111);
        auVar65 = vandps_avx(auVar66,auVar92);
        *(int *)(uVar60 + 0x20 + uVar57 * 4) = auVar80._0_4_;
        uVar7 = vextractps_avx(auVar80,1);
        *(undefined4 *)(uVar60 + 0x40 + uVar57 * 4) = uVar7;
        auVar100._0_4_ = auVar65._0_4_ * 4.7683716e-07 + auVar66._0_4_;
        auVar100._4_4_ = auVar65._4_4_ * 4.7683716e-07 + auVar66._4_4_;
        auVar100._8_4_ = auVar65._8_4_ * 4.7683716e-07 + auVar66._8_4_;
        auVar100._12_4_ = auVar65._12_4_ * 4.7683716e-07 + auVar66._12_4_;
        uVar7 = vextractps_avx(auVar80,2);
        *(undefined4 *)(uVar60 + 0x60 + uVar57 * 4) = uVar7;
        *(float *)(uVar60 + 0x30 + uVar57 * 4) = auVar105._0_4_;
        uVar7 = vextractps_avx(auVar105,1);
        *(undefined4 *)(uVar60 + 0x50 + uVar57 * 4) = uVar7;
        auVar65 = vsubps_avx(auVar67,auVar80);
        uVar7 = vextractps_avx(auVar105,2);
        *(undefined4 *)(uVar60 + 0x70 + uVar57 * 4) = uVar7;
        *(int *)(uVar60 + 0x80 + uVar57 * 4) = auVar65._0_4_;
        uVar7 = vextractps_avx(auVar65,1);
        *(undefined4 *)(uVar60 + 0xa0 + uVar57 * 4) = uVar7;
        auVar67 = vsubps_avx(auVar100,auVar105);
        uVar7 = vextractps_avx(auVar65,2);
        *(undefined4 *)(uVar60 + 0xc0 + uVar57 * 4) = uVar7;
        *(int *)(uVar60 + 0x90 + uVar57 * 4) = auVar67._0_4_;
        uVar7 = vextractps_avx(auVar67,1);
        *(undefined4 *)(uVar60 + 0xb0 + uVar57 * 4) = uVar7;
        uVar7 = vextractps_avx(auVar67,2);
        *(undefined4 *)(uVar60 + 0xd0 + uVar57 * 4) = uVar7;
        uVar57 = uVar57 + 1;
        pfVar41 = pfVar41 + 0x18;
      } while (local_848 != uVar57);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::QuadMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar60 = uStack_1850;
  uVar57 = local_1858;
  if (((undefined1  [16])local_1da8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (__return_storage_ptr__->ref).ptr = uVar40 | (ulong)pcVar58;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e58._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e08._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)local_18b8;
    v1.field_0.i[2] = 0x7f800000;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.i[3] = 0x7f800000;
    local_1b28._0_8_ = 0xff800000ff800000;
    local_1b28._8_8_ = 0xff800000ff800000;
    uStack_1b18 = 0x7f8000007f800000;
    uStack_1b10 = 0x7f8000007f800000;
    local_1b08 = 0xff800000ff800000;
    uStack_1b00 = 0xff800000ff800000;
    if (uStack_1850 - local_1858 < 0xc00) {
      v0.field_0.v[1] = uStack_1850;
      v0.field_0.v[0] = local_1858;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      v0.field_0.v[1]._4_2_ = 0x401;
      auStack_1c18._0_4_ = 0.0;
      auStack_1c18._4_4_ = 0.0;
      auStack_1c18._8_4_ = 0.0;
      auStack_1c18._12_4_ = 0.0;
      aStack_1bf8.m128[0] = 1.12104e-44;
      aStack_1bf8.m128[1] = 0.0;
      tbb::detail::r1::initialize((task_group_context *)&v0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar57;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar60;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar33 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar33 != '\0') {
        prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar46,"task cancelled");
        __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v0);
    }
    (__return_storage_ptr__->ref).ptr = uVar40 | (ulong)pcVar58;
    *(longlong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         v2.field_0.v[1];
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(aStack_1cd8.m128[3],aStack_1cd8.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
    local_1dd8._0_8_ = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
    local_1dd8._12_4_ = aStack_1cb8.i[3];
    local_1dd8._8_4_ = aStack_1cb8.i[2];
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dd8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dd8._8_8_;
  __return_storage_ptr__->dt = BStack_1830;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar40 = 0;
  do {
    pBVar15 = local_8c8[uVar40];
    pBVar47 = pBVar15 + 1;
    *pBVar47 = (BBox1f)((long)*pBVar47 + -1);
    if ((*pBVar47 == (BBox1f)0x0) && (BVar8 = *pBVar15, BVar8 != (BBox1f)0x0)) {
      lVar35 = *(undefined8 *)((long)BVar8 + 0x18);
      pvVar39 = *(void **)((long)BVar8 + 0x20);
      if (pvVar39 != (void *)0x0) {
        if ((ulong)(lVar35 * 0x50) < 0x1c00000) {
          alignedFree(pvVar39);
        }
        else {
          os_free(pvVar39,lVar35 * 0x50,*(bool *)((long)BVar8 + 8));
        }
      }
      if (lVar35 != 0) {
        (**(code **)**(undefined8 **)BVar8)(*(undefined8 **)BVar8,lVar35 * -0x50,1);
      }
      *(undefined8 *)((long)BVar8 + 0x10) = 0;
      *(undefined8 *)((long)BVar8 + 0x18) = 0;
      *(undefined8 *)((long)BVar8 + 0x20) = 0;
      operator_delete((void *)BVar8);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }